

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPool.c
# Opt level: O2

void sbfPoolAtExit(void)

{
  int iVar1;
  undefined4 uVar2;
  sbfPoolCountImpl *psVar3;
  sbfPoolCountTree sVar4;
  sbfPoolCountTree *psVar5;
  sbfPoolCountImpl *psVar6;
  sbfPoolCountImpl *psVar7;
  sbfPoolCountImpl *psVar8;
  sbfPoolCountImpl *psVar9;
  int iVar10;
  sbfPoolCountTree sVar11;
  sbfPoolCountImpl *psVar12;
  u_int i;
  ulong uVar13;
  sbfPoolCountImpl *elm;
  sbfPoolCountImpl *psVar14;
  anon_struct_32_4_548b78d9_for_mTreeEntry *paVar15;
  
  for (uVar13 = 0; uVar13 < gSbfPoolAtExitListSize; uVar13 = uVar13 + 1) {
    sbfPool_destroy(gSbfPoolAtExitList[uVar13]);
  }
  free(gSbfPoolAtExitList);
  gSbfPoolAtExitListSize = 0;
  psVar5 = &gSbfPoolCountTree;
  psVar14 = (sbfPoolCountImpl *)0x0;
  do {
    elm = psVar14;
    psVar14 = ((anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar5)->rbe_left;
    psVar5 = (sbfPoolCountTree *)&psVar14->mTreeEntry;
  } while (psVar14 != (sbfPoolCountImpl *)0x0);
  do {
    if (elm == (sbfPoolCountImpl *)0x0) {
      return;
    }
    psVar6 = sbfPoolCountTreeImpl_RB_NEXT(elm);
    psVar14 = (elm->mTreeEntry).rbe_left;
    psVar7 = (elm->mTreeEntry).rbe_right;
    if (psVar14 == (sbfPoolCountImpl *)0x0) {
      psVar8 = (elm->mTreeEntry).rbe_parent;
      iVar10 = (elm->mTreeEntry).rbe_color;
      if (psVar7 != (sbfPoolCountImpl *)0x0) goto LAB_001079b3;
      psVar7 = (sbfPoolCountImpl *)0x0;
LAB_001079bf:
      paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
      if (psVar8 != (sbfPoolCountImpl *)0x0) {
        paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar8->mTreeEntry).rbe_right;
        if ((psVar8->mTreeEntry).rbe_left == elm) {
          paVar15 = &psVar8->mTreeEntry;
        }
      }
      paVar15->rbe_left = psVar7;
    }
    else {
      if (psVar7 == (sbfPoolCountImpl *)0x0) {
        psVar8 = (elm->mTreeEntry).rbe_parent;
        iVar10 = (elm->mTreeEntry).rbe_color;
        psVar7 = psVar14;
LAB_001079b3:
        (psVar7->mTreeEntry).rbe_parent = psVar8;
        goto LAB_001079bf;
      }
      do {
        psVar14 = psVar7;
        psVar7 = (psVar14->mTreeEntry).rbe_left;
      } while (psVar7 != (sbfPoolCountImpl *)0x0);
      psVar7 = (psVar14->mTreeEntry).rbe_right;
      psVar8 = (psVar14->mTreeEntry).rbe_parent;
      iVar10 = (psVar14->mTreeEntry).rbe_color;
      if (psVar7 != (sbfPoolCountImpl *)0x0) {
        (psVar7->mTreeEntry).rbe_parent = psVar8;
      }
      paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
      if (psVar8 != (sbfPoolCountImpl *)0x0) {
        paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar8->mTreeEntry).rbe_right;
        if ((psVar8->mTreeEntry).rbe_left == psVar14) {
          paVar15 = &psVar8->mTreeEntry;
        }
      }
      paVar15->rbe_left = psVar7;
      if ((psVar14->mTreeEntry).rbe_parent == elm) {
        psVar8 = psVar14;
      }
      psVar12 = (elm->mTreeEntry).rbe_left;
      psVar9 = (elm->mTreeEntry).rbe_right;
      iVar1 = (elm->mTreeEntry).rbe_color;
      uVar2 = *(undefined4 *)&(elm->mTreeEntry).field_0x1c;
      (psVar14->mTreeEntry).rbe_parent = (elm->mTreeEntry).rbe_parent;
      (psVar14->mTreeEntry).rbe_color = iVar1;
      *(undefined4 *)&(psVar14->mTreeEntry).field_0x1c = uVar2;
      (psVar14->mTreeEntry).rbe_left = psVar12;
      (psVar14->mTreeEntry).rbe_right = psVar9;
      psVar12 = (elm->mTreeEntry).rbe_parent;
      paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
      if (psVar12 != (sbfPoolCountImpl *)0x0) {
        paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar12->mTreeEntry).rbe_right;
        if ((psVar12->mTreeEntry).rbe_left == elm) {
          paVar15 = &psVar12->mTreeEntry;
        }
      }
      paVar15->rbe_left = psVar14;
      (((elm->mTreeEntry).rbe_left)->mTreeEntry).rbe_parent = psVar14;
      psVar12 = (elm->mTreeEntry).rbe_right;
      if (psVar12 != (sbfPoolCountImpl *)0x0) {
        (psVar12->mTreeEntry).rbe_parent = psVar14;
      }
      psVar14 = psVar8;
      if (psVar8 == (sbfPoolCountImpl *)0x0) {
        psVar8 = (sbfPoolCountImpl *)0x0;
      }
      else {
        do {
          psVar14 = (psVar14->mTreeEntry).rbe_parent;
        } while (psVar14 != (sbfPoolCountImpl *)0x0);
      }
    }
    sVar11.rbh_root = gSbfPoolCountTree.rbh_root;
    if (iVar10 == 0) {
      while( true ) {
        if (psVar7 == (sbfPoolCountImpl *)0x0) {
          if (sVar11.rbh_root == (sbfPoolCountImpl *)0x0) goto LAB_00107cb2;
        }
        else if (((psVar7->mTreeEntry).rbe_color != 0) || (psVar7 == sVar11.rbh_root))
        goto LAB_00107cae;
        psVar14 = (psVar8->mTreeEntry).rbe_left;
        psVar12 = sVar11.rbh_root;
        if (psVar14 == psVar7) {
          psVar14 = (psVar8->mTreeEntry).rbe_right;
          psVar9 = psVar14;
          if ((psVar14->mTreeEntry).rbe_color == 1) {
            (psVar14->mTreeEntry).rbe_color = 0;
            (psVar8->mTreeEntry).rbe_color = 1;
            psVar9 = (psVar14->mTreeEntry).rbe_left;
            (psVar8->mTreeEntry).rbe_right = psVar9;
            if (psVar9 != (sbfPoolCountImpl *)0x0) {
              (psVar9->mTreeEntry).rbe_parent = psVar8;
            }
            psVar7 = (psVar8->mTreeEntry).rbe_parent;
            (psVar14->mTreeEntry).rbe_parent = psVar7;
            psVar12 = psVar14;
            sVar4.rbh_root = psVar14;
            if (psVar7 != (sbfPoolCountImpl *)0x0) {
              if (psVar8 == (psVar7->mTreeEntry).rbe_left) {
                (psVar7->mTreeEntry).rbe_left = psVar14;
                psVar12 = sVar11.rbh_root;
                sVar4 = gSbfPoolCountTree;
              }
              else {
                (psVar7->mTreeEntry).rbe_right = psVar14;
                psVar9 = (psVar8->mTreeEntry).rbe_right;
                psVar12 = sVar11.rbh_root;
                sVar4 = gSbfPoolCountTree;
              }
            }
            gSbfPoolCountTree.rbh_root = sVar4.rbh_root;
            (psVar14->mTreeEntry).rbe_left = psVar8;
            (psVar8->mTreeEntry).rbe_parent = psVar14;
          }
          psVar14 = (psVar9->mTreeEntry).rbe_left;
          if ((psVar14 == (sbfPoolCountImpl *)0x0) || ((psVar14->mTreeEntry).rbe_color == 0)) {
            psVar7 = (psVar9->mTreeEntry).rbe_right;
            if ((psVar7 == (sbfPoolCountImpl *)0x0) || ((psVar7->mTreeEntry).rbe_color == 0))
            goto LAB_00107b24;
          }
          else {
            psVar7 = (psVar9->mTreeEntry).rbe_right;
            if ((psVar7 == (sbfPoolCountImpl *)0x0) || ((psVar7->mTreeEntry).rbe_color == 0)) {
              (psVar14->mTreeEntry).rbe_color = 0;
              (psVar9->mTreeEntry).rbe_color = 1;
              psVar7 = (psVar14->mTreeEntry).rbe_right;
              (psVar9->mTreeEntry).rbe_left = psVar7;
              if (psVar7 != (sbfPoolCountImpl *)0x0) {
                (psVar7->mTreeEntry).rbe_parent = psVar9;
              }
              psVar7 = (psVar9->mTreeEntry).rbe_parent;
              (psVar14->mTreeEntry).rbe_parent = psVar7;
              paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
              psVar3 = psVar14;
              if (psVar7 != (sbfPoolCountImpl *)0x0) {
                paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)
                          &(psVar7->mTreeEntry).rbe_right;
                psVar3 = psVar12;
                if (psVar9 == (psVar7->mTreeEntry).rbe_left) {
                  paVar15 = &psVar7->mTreeEntry;
                }
              }
              psVar12 = psVar3;
              paVar15->rbe_left = psVar14;
              (psVar14->mTreeEntry).rbe_right = psVar9;
              (psVar9->mTreeEntry).rbe_parent = psVar14;
              psVar9 = (psVar8->mTreeEntry).rbe_right;
              psVar7 = (psVar9->mTreeEntry).rbe_right;
            }
          }
          (psVar9->mTreeEntry).rbe_color = (psVar8->mTreeEntry).rbe_color;
          (psVar8->mTreeEntry).rbe_color = 0;
          if (psVar7 != (sbfPoolCountImpl *)0x0) {
            (psVar7->mTreeEntry).rbe_color = 0;
          }
          psVar14 = (psVar9->mTreeEntry).rbe_left;
          (psVar8->mTreeEntry).rbe_right = psVar14;
          if (psVar14 != (sbfPoolCountImpl *)0x0) {
            (psVar14->mTreeEntry).rbe_parent = psVar8;
          }
          psVar14 = (psVar8->mTreeEntry).rbe_parent;
          (psVar9->mTreeEntry).rbe_parent = psVar14;
          psVar7 = psVar9;
          paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
          if (psVar14 != (sbfPoolCountImpl *)0x0) {
            psVar7 = psVar12;
            paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar14->mTreeEntry).rbe_right;
            if (psVar8 == (psVar14->mTreeEntry).rbe_left) {
              paVar15 = &psVar14->mTreeEntry;
            }
          }
          paVar15->rbe_left = psVar9;
          (psVar9->mTreeEntry).rbe_left = psVar8;
          goto LAB_00107ca5;
        }
        psVar9 = psVar14;
        if ((psVar14->mTreeEntry).rbe_color == 1) {
          (psVar14->mTreeEntry).rbe_color = 0;
          (psVar8->mTreeEntry).rbe_color = 1;
          psVar9 = (psVar14->mTreeEntry).rbe_right;
          (psVar8->mTreeEntry).rbe_left = psVar9;
          if (psVar9 != (sbfPoolCountImpl *)0x0) {
            (psVar9->mTreeEntry).rbe_parent = psVar8;
          }
          psVar7 = (psVar8->mTreeEntry).rbe_parent;
          (psVar14->mTreeEntry).rbe_parent = psVar7;
          psVar12 = psVar14;
          sVar4.rbh_root = psVar14;
          if (psVar7 != (sbfPoolCountImpl *)0x0) {
            if (psVar8 == (psVar7->mTreeEntry).rbe_left) {
              (psVar7->mTreeEntry).rbe_left = psVar14;
              psVar9 = (psVar8->mTreeEntry).rbe_left;
              psVar12 = sVar11.rbh_root;
              sVar4 = gSbfPoolCountTree;
            }
            else {
              (psVar7->mTreeEntry).rbe_right = psVar14;
              psVar12 = sVar11.rbh_root;
              sVar4 = gSbfPoolCountTree;
            }
          }
          gSbfPoolCountTree.rbh_root = sVar4.rbh_root;
          (psVar14->mTreeEntry).rbe_right = psVar8;
          (psVar8->mTreeEntry).rbe_parent = psVar14;
        }
        psVar14 = (psVar9->mTreeEntry).rbe_left;
        if ((psVar14 != (sbfPoolCountImpl *)0x0) && ((psVar14->mTreeEntry).rbe_color != 0))
        goto LAB_00107b97;
        psVar7 = (psVar9->mTreeEntry).rbe_right;
        if ((psVar7 != (sbfPoolCountImpl *)0x0) && ((psVar7->mTreeEntry).rbe_color != 0)) break;
LAB_00107b24:
        (psVar9->mTreeEntry).rbe_color = 1;
        psVar7 = psVar8;
        psVar8 = (psVar8->mTreeEntry).rbe_parent;
        sVar11.rbh_root = psVar12;
      }
      if ((psVar14 == (sbfPoolCountImpl *)0x0) || ((psVar14->mTreeEntry).rbe_color == 0)) {
        (psVar7->mTreeEntry).rbe_color = 0;
        (psVar9->mTreeEntry).rbe_color = 1;
        psVar14 = (psVar7->mTreeEntry).rbe_left;
        (psVar9->mTreeEntry).rbe_right = psVar14;
        if (psVar14 != (sbfPoolCountImpl *)0x0) {
          (psVar14->mTreeEntry).rbe_parent = psVar9;
        }
        psVar14 = (psVar9->mTreeEntry).rbe_parent;
        (psVar7->mTreeEntry).rbe_parent = psVar14;
        paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
        psVar3 = psVar7;
        if (psVar14 != (sbfPoolCountImpl *)0x0) {
          paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar14->mTreeEntry).rbe_right;
          psVar3 = psVar12;
          if (psVar9 == (psVar14->mTreeEntry).rbe_left) {
            paVar15 = &psVar14->mTreeEntry;
          }
        }
        psVar12 = psVar3;
        paVar15->rbe_left = psVar7;
        (psVar7->mTreeEntry).rbe_left = psVar9;
        (psVar9->mTreeEntry).rbe_parent = psVar7;
        psVar9 = (psVar8->mTreeEntry).rbe_left;
        psVar14 = (psVar9->mTreeEntry).rbe_left;
      }
LAB_00107b97:
      (psVar9->mTreeEntry).rbe_color = (psVar8->mTreeEntry).rbe_color;
      (psVar8->mTreeEntry).rbe_color = 0;
      if (psVar14 != (sbfPoolCountImpl *)0x0) {
        (psVar14->mTreeEntry).rbe_color = 0;
      }
      psVar14 = (psVar9->mTreeEntry).rbe_right;
      (psVar8->mTreeEntry).rbe_left = psVar14;
      if (psVar14 != (sbfPoolCountImpl *)0x0) {
        (psVar14->mTreeEntry).rbe_parent = psVar8;
      }
      psVar14 = (psVar8->mTreeEntry).rbe_parent;
      (psVar9->mTreeEntry).rbe_parent = psVar14;
      psVar7 = psVar9;
      paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
      if (psVar14 != (sbfPoolCountImpl *)0x0) {
        psVar7 = psVar12;
        paVar15 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar14->mTreeEntry).rbe_right;
        if (psVar8 == (psVar14->mTreeEntry).rbe_left) {
          paVar15 = &psVar14->mTreeEntry;
        }
      }
      paVar15->rbe_left = psVar9;
      (psVar9->mTreeEntry).rbe_right = psVar8;
LAB_00107ca5:
      (psVar8->mTreeEntry).rbe_parent = psVar9;
      if (psVar7 != (sbfPoolCountImpl *)0x0) {
LAB_00107cae:
        (psVar7->mTreeEntry).rbe_color = 0;
      }
    }
LAB_00107cb2:
    free(elm);
    elm = psVar6;
  } while( true );
}

Assistant:

static void
sbfPoolAtExit (void)
{
    u_int        i;
    sbfPoolCount count;
    sbfPoolCount count1;

    for (i = 0; i < gSbfPoolAtExitListSize; i++)
        sbfPool_destroy (gSbfPoolAtExitList[i]);
    free (gSbfPoolAtExitList);
    gSbfPoolAtExitListSize = 0;

    RB_FOREACH_SAFE (count, sbfPoolCountTreeImpl, &gSbfPoolCountTree, count1)
    {
        RB_REMOVE (sbfPoolCountTreeImpl, &gSbfPoolCountTree, count);
        free (count);
    }
}